

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc_none.c
# Opt level: O3

void mbc_none_write(gb_cart *cart,uint16_t addr,uint8_t byte)

{
  if (cart != (gb_cart *)0x0) {
    if ((addr & 0xe000) == 0xa000) {
      cart->ram[(ulong)addr - 0xa000] = byte;
    }
    return;
  }
  __assert_fail("cart != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc_none.c"
                ,0x2e,"void mbc_none_write(struct gb_cart *, uint16_t, uint8_t)");
}

Assistant:

void mbc_none_write(struct gb_cart *cart, uint16_t addr, uint8_t byte)
{
    assert(cart != NULL);

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
        // ROM writing is not allowed
        break;

    case 0xA000:
    case 0xB000:
        // External RAM
        cart->ram[addr - 0xA000] = byte;
        break;
    
    default:
        break;
    }
}